

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# widgets.cpp
# Opt level: O0

void __thiscall
dlib::perspective_display::on_wheel_down(perspective_display *this,unsigned_long param_2)

{
  bool bVar1;
  camera_transform *in_RDI;
  camera_transform *this_00;
  vector<double,_3L> delta;
  double alpha;
  unsigned_long in_stack_00000248;
  double in_stack_00000250;
  vector<double,_3L> *in_stack_00000258;
  vector<double,_3L> *in_stack_00000260;
  vector<double,_3L> *in_stack_00000268;
  camera_transform *in_stack_00000270;
  camera_transform *in_stack_fffffffffffffe58;
  unsigned_long local_198;
  vector<double,_3L> *in_stack_fffffffffffffe70;
  double *in_stack_fffffffffffffe78;
  vector<double,_3L> *in_stack_fffffffffffffe90;
  vector<double,_3L> *in_stack_fffffffffffffe98;
  rectangle *in_stack_fffffffffffffed8;
  base_window *in_stack_fffffffffffffee0;
  
  bVar1 = rectangle::contains((rectangle *)
                              ((in_RDI->camera_pos).
                               super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                               .data.data + 1),
                              *(long *)(in_RDI->camera_up_direction).
                                       super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                                       .data.data[2],*(long *)in_RDI->camera_field_of_view);
  if (((bVar1) &&
      (((ulong)(in_RDI->camera_up_direction).
               super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
               .data.data[1] & 1) == 0)) &&
     ((*(byte *)((long)(in_RDI->camera_up_direction).
                       super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                       .data.data + 9) & 1) != 0)) {
    camera_transform::get_camera_pos(in_stack_fffffffffffffe58);
    camera_transform::get_camera_looking_at(in_stack_fffffffffffffe58);
    dlib::operator-(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    dlib::operator*(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
    camera_transform::get_camera_pos(in_stack_fffffffffffffe58);
    dlib::operator+(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
    camera_transform::get_camera_looking_at(in_stack_fffffffffffffe58);
    camera_transform::get_camera_up_direction(in_stack_fffffffffffffe58);
    this_00 = (camera_transform *)
              camera_transform::get_camera_field_of_view
                        ((camera_transform *)
                         (in_RDI[1].camera_pos.
                          super_matrix<double,_3L,_1L,_dlib::memory_manager_stateless_kernel_1<char>,_dlib::row_major_layout>
                          .data.data + 2));
    rectangle::width((rectangle *)this_00);
    local_198 = rectangle::height((rectangle *)this_00);
    std::min<unsigned_long>((unsigned_long *)&stack0xfffffffffffffe70,&local_198);
    camera_transform::camera_transform
              (in_stack_00000270,in_stack_00000268,in_stack_00000260,in_stack_00000258,
               in_stack_00000250,in_stack_00000248);
    camera_transform::operator=(in_RDI,this_00);
    base_window::invalidate_rectangle(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  return;
}

Assistant:

void perspective_display::
    on_wheel_down (
        unsigned long //state
    )
    {
        if (rect.contains(lastx,lasty) == false || hidden || !enabled)
            return;

        const double alpha = 0.10;
        const vector<double> delta = alpha*(tform.get_camera_pos() - tform.get_camera_looking_at());
        tform = camera_transform(
            tform.get_camera_pos() + delta,
            tform.get_camera_looking_at(),
            tform.get_camera_up_direction(),
            tform.get_camera_field_of_view(),
            std::min(rect.width(),rect.height()));
        parent.invalidate_rectangle(rect);
    }